

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O2

void pzshape::TPZShapePiram::ShapeGenerating
               (TPZVec<double> *pt,TPZVec<int> *nshape,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long row;
  
  for (lVar16 = 5; lVar16 != 0xd; lVar16 = lVar16 + 1) {
    if (0 < nshape->fStore[lVar16 + -5]) {
      iVar10 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar16,0);
      iVar11 = pztopology::TPZPyramid::ContainedSideLocId((int)lVar16,1);
      lVar14 = (long)iVar10;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar1 = *pdVar13;
      lVar15 = (long)iVar11;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar16,0);
      *pdVar13 = dVar1 * dVar2;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar14);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar15);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar16);
      *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar14);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar15);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar16);
      *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar14);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar15);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar16);
      *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
    }
  }
  pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,0xd,0);
  *pdVar13 = dVar1 * dVar2;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,0,2);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xd);
  *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,1,2);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xd);
  *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0);
  dVar1 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
  dVar2 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
  dVar3 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,2,2);
  dVar4 = *pdVar13;
  pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0xd);
  *pdVar13 = dVar3 * dVar4 + dVar1 * dVar2;
  for (lVar16 = 0xe; lVar16 != 0x12; lVar16 = lVar16 + 1) {
    if (0 < nshape->fStore[lVar16 + -5]) {
      iVar12 = (int)lVar16;
      iVar10 = pztopology::TPZPyramid::ContainedSideLocId(iVar12,0);
      iVar11 = pztopology::TPZPyramid::ContainedSideLocId(iVar12,1);
      iVar12 = pztopology::TPZPyramid::ContainedSideLocId(iVar12,2);
      row = (long)iVar10;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar1 = *pdVar13;
      lVar14 = (long)iVar11;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar2 = *pdVar13;
      lVar15 = (long)iVar12;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar16,0);
      *pdVar13 = dVar1 * dVar2 * dVar3;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,row);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar14);
      dVar5 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar6 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar7 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar8 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar15);
      dVar9 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar16);
      *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,row);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar14);
      dVar5 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar6 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar7 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar8 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar15);
      dVar9 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar16);
      *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,row);
      dVar1 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar2 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar3 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar4 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar14);
      dVar5 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar15,0);
      dVar6 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,row,0);
      dVar7 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar14,0);
      dVar8 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar15);
      dVar9 = *pdVar13;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar16);
      *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
    }
  }
  if (0 < nshape->fStore[0xd]) {
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar3 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0x12,0);
    *pdVar13 = dVar1 * dVar2 * dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar3 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar4 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,2);
    dVar5 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar6 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar7 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar8 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,4);
    dVar9 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0x12);
    *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar3 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar4 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,2);
    dVar5 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar6 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar7 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar8 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,4);
    dVar9 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0x12);
    *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar2 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar3 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar4 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,2);
    dVar5 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,4,0);
    dVar6 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,0,0);
    dVar7 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,2,0);
    dVar8 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,4);
    dVar9 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0x12);
    *pdVar13 = dVar7 * dVar8 * dVar9 + dVar4 * dVar5 * dVar6 + dVar1 * dVar2 * dVar3;
  }
  for (lVar16 = 5; lVar16 != 9; lVar16 = lVar16 + 1) {
    pdVar13 = TPZFMatrix<double>::operator()(phi,0xd,0);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(phi,lVar16,0);
    *pdVar13 = dVar1 + *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,0xd);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar16);
    *pdVar13 = dVar1 + *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,0xd);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar16);
    *pdVar13 = dVar1 + *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,0xd);
    dVar1 = *pdVar13;
    pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar16);
    *pdVar13 = dVar1 + *pdVar13;
  }
  for (lVar16 = 5; lVar16 != 0x13; lVar16 = lVar16 + 1) {
    if (0 < nshape->fStore[lVar16 + -5]) {
      dVar1 = *(double *)(&DAT_01309f60 + lVar16 * 8);
      pdVar13 = TPZFMatrix<double>::operator()(phi,lVar16,0);
      *pdVar13 = *pdVar13 * dVar1;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,0,lVar16);
      *pdVar13 = *pdVar13 * dVar1;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,1,lVar16);
      *pdVar13 = *pdVar13 * dVar1;
      pdVar13 = TPZFMatrix<double>::operator()(dphi,2,lVar16);
      *pdVar13 = dVar1 * *pdVar13;
    }
  }
  return;
}

Assistant:

void TPZShapePiram::ShapeGenerating(const TPZVec<REAL> &pt, TPZVec<int> &nshape, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi)
    {
        int is;
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+8; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        // contribution of the faces
        // quadrilateral face
        is = 13;
        {
            int is1,is2;
            is1 = ShapeFaceId[0][0];// SideConnectLocId(is,0);
            is2 = ShapeFaceId[0][2];// SideConnectLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)+phi(is1,0)*dphi(0,is2);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)+phi(is1,0)*dphi(1,is2);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)+phi(is1,0)*dphi(2,is2);
        }
        is++;
        // triangular faces
        for(;is<18; is++)
        {
            if(nshape[is-NCornerNodes] < 1) continue;
            int is1,is2,is3;
            is1 = ContainedSideLocId(is,0);
            is2 = ContainedSideLocId(is,1);
            is3 = ContainedSideLocId(is,2);
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
            
        }
        if(nshape[NSides-NCornerNodes-1] > 0)
        {
            int is1 = 0;
            int is2 = 2;
            int is3 = 4;
            phi(is,0) = phi(is1,0)*phi(is2,0)*phi(is3,0);
            dphi(0,is) = dphi(0,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(0,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(0,is3);
            dphi(1,is) = dphi(1,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(1,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(1,is3);
            dphi(2,is) = dphi(2,is1)*phi(is2,0)*phi(is3,0)+phi(is1,0)*dphi(2,is2)*phi(is3,0)+phi(is1,0)*phi(is2,0)*dphi(2,is3);
        }
        
        // Make the generating shape functions linear and unitary
        // contribute the ribs
        for(is=NCornerNodes; is<NCornerNodes+4; is++)
        {
            int isface = 13;
            phi(is,0) += phi(isface,0);
            dphi(0,is) += dphi(0,isface);
            dphi(1,is) += dphi(1,isface);
            dphi(2,is) += dphi(2,isface);
        }
        // scaling the shapefunctions
        {
            REAL sidescale[] = {1.,1.,1.,1.,1.,4.,4.,4.,4.,4.,4.,4.,4.,16.,27.,27.,27.,27.,64.};
            for(is=5; is<NSides; is++)
            {
                if(nshape[is-NCornerNodes] < 1) continue;
                phi(is,0) *= sidescale[is];
                dphi(0,is) *= sidescale[is];
                dphi(1,is) *= sidescale[is];
                dphi(2,is) *= sidescale[is];
            }
        }
        
        
    }